

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O1

void __thiscall
timertt::details::
timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::execute_timer_in_processing<timertt::details::thread_mixin::lock_guard>
          (timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
           *this,lock_guard *lock)

{
  timer_type *ptVar1;
  ostringstream ss;
  
  std::unique_lock<std::mutex>::unlock(&lock->m_lock);
  ptVar1 = this->m_timer_in_processing;
  if ((ptVar1->m_action).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(ptVar1->m_action)._M_invoker)((_Any_data *)&ptVar1->m_action);
    std::unique_lock<std::mutex>::lock(&lock->m_lock);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void
	execute_timer_in_processing(
		//! Object lock.
		//! This lock will be unlocked before execution of actions
		//! and locked back after.
		UNIQUE_LOCK & lock )
	{
		lock.unlock();

		try
		{
			m_timer_in_processing->m_action();
		}
		catch( const std::exception & x )
		{
			this->m_exception_handler( x );
		}
		catch( ... )
		{
			std::ostringstream ss;
			ss << __FILE__ << "(" << __LINE__ 
				<< "): an unknown exception from timer action";
			this->m_error_logger( ss.str() );
			std::abort();
		}

		lock.lock();
	}